

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall
Dialog::Dialog(Dialog *this,Theme *theme,ALLEGRO_DISPLAY *display,int grid_m,int grid_n)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  *(undefined4 *)(in_RDI + 3) = in_ECX;
  *(undefined4 *)((long)in_RDI + 0x1c) = in_R8D;
  *(undefined4 *)(in_RDI + 4) = 1;
  *(undefined4 *)((long)in_RDI + 0x24) = 1;
  *(undefined1 *)(in_RDI + 5) = 1;
  *(undefined1 *)((long)in_RDI + 0x29) = 0;
  std::__cxx11::list<Widget_*,_std::allocator<Widget_*>_>::list
            ((list<Widget_*,_std::allocator<Widget_*>_> *)0x10b5fe);
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  uVar2 = al_create_event_queue();
  in_RDI[2] = uVar2;
  uVar2 = in_RDI[2];
  uVar3 = al_get_keyboard_event_source();
  al_register_event_source(uVar2,uVar3);
  uVar2 = in_RDI[2];
  uVar3 = al_get_mouse_event_source();
  al_register_event_source(uVar2,uVar3);
  uVar2 = in_RDI[2];
  uVar3 = al_get_display_event_source(in_RDX);
  al_register_event_source(uVar2,uVar3);
  bVar1 = al_is_touch_input_installed();
  if ((bVar1 & 1) != 0) {
    uVar2 = in_RDI[2];
    uVar3 = al_get_touch_input_mouse_emulation_event_source();
    al_register_event_source(uVar2,uVar3);
  }
  return;
}

Assistant:

Dialog::Dialog(const Theme & theme, ALLEGRO_DISPLAY *display,
      int grid_m, int grid_n):
   theme(theme),
   display(display),
   grid_m(grid_m),
   grid_n(grid_n),
   x_padding(1),
   y_padding(1),

   draw_requested(true),
   quit_requested(false),
   mouse_over_widget(NULL),
   mouse_down_widget(NULL),
   key_widget(NULL),

   event_handler(NULL)
{
   this->event_queue = al_create_event_queue();
   al_register_event_source(this->event_queue, al_get_keyboard_event_source());
   al_register_event_source(this->event_queue, al_get_mouse_event_source());
   al_register_event_source(this->event_queue, al_get_display_event_source(display));
   if (al_is_touch_input_installed()) {
      al_register_event_source(this->event_queue,
         al_get_touch_input_mouse_emulation_event_source());
   }
}